

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptSymbol::ToString(PropertyRecord *propertyRecord,ScriptContext *requestContext)

{
  CompoundString *this;
  uint appendCharLength;
  
  appendCharLength = propertyRecord->byteCount >> 1;
  this = CompoundString::NewWithCharCapacity
                   (appendCharLength + 9,(requestContext->super_ScriptContextBase).javascriptLibrary
                   );
  CompoundString::AppendChars(this,L"Symbol(",7);
  CompoundString::AppendChars(this,(char16 *)(propertyRecord + 1),appendCharLength);
  CompoundString::AppendChars(this,L')');
  return (JavascriptString *)this;
}

Assistant:

JavascriptString* JavascriptSymbol::ToString(const PropertyRecord* propertyRecord, ScriptContext * requestContext)
    {
        const char16* description = propertyRecord->GetBuffer();
        uint len = propertyRecord->GetLength();
        CompoundString* str = CompoundString::NewWithCharCapacity(len + _countof(_u("Symbol()")), requestContext->GetLibrary());

        str->AppendChars(_u("Symbol("), _countof(_u("Symbol(")) - 1);
        str->AppendChars(description, len);
        str->AppendChars(_u(')'));

        return str;
    }